

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (locator *__return_storage_ptr__,void *this,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,ArgTokens *args_2)

{
  StackAllocStorage<320ul,16ul> *this_00;
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t groups_size_index;
  ulong uVar6;
  long lVar7;
  undefined1 *__s;
  float fVar8;
  arrays_type new_arrays_;
  
  this_00 = *this;
  fVar8 = ceilf((float)(*(ulong *)((long)this + 0x30) / 0x3d + *(ulong *)((long)this + 0x30) + 1) /
                0.875);
  uVar6 = (long)(fVar8 - 9.223372e+18) & (long)fVar8 >> 0x3f | (long)fVar8;
  uVar3 = uVar6 / 0xf;
  uVar4 = 0x40;
  if (uVar3 != 0) {
    uVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x3f;
  }
  new_arrays_.groups_size_index = 0x3f;
  if (0x1d < uVar6) {
    new_arrays_.groups_size_index = uVar4;
  }
  bVar1 = (byte)new_arrays_.groups_size_index;
  lVar7 = 1L << (-bVar1 & 0x3f);
  new_arrays_.groups_size_mask = lVar7 - 1;
  new_arrays_.elements_ = (value_type_pointer)0x0;
  if (uVar6 == 0) {
    __s = dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
  }
  else {
    bVar2 = 0x40 - bVar1;
    uVar4 = (0x268L << (bVar2 & 0x3f)) + 0xe;
    new_arrays_.elements_ =
         (value_type_pointer)
         slang::detail::hashing::StackAllocStorage<320ul,16ul>::allocate<8ul>
                   (this_00,uVar4 - uVar4 % 0x28);
    lVar5 = 600L << (bVar2 & 0x3f);
    __s = (undefined1 *)
          ((long)&new_arrays_.elements_[-1].first._M_len +
          (ulong)(-((int)new_arrays_.elements_ + (int)lVar5 + -0x28) & 0xf) + lVar5);
    memset(__s,0,0x10L << (bVar2 & 0x3f));
    ((group_type_pointer)((long)__s + (lVar7 + -1) * 0x10))->m[0xe].n = '\x01';
  }
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)0x0;
  new_arrays_.groups_ = (group_type_pointer)__s;
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
            (__return_storage_ptr__,&new_arrays_,(arrays_type *)(hash >> (bVar1 & 0x3f)),hash,
             (size_t)args,(try_emplace_args_t *)args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)hash,(ArgTokens *)args);
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                      *)this,&new_arrays_);
  *(long *)((long)this + 0x30) = *(long *)((long)this + 0x30) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }